

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.cpp
# Opt level: O2

void just_test_test_case_f_test_read_and_write_file(void)

{
  allocator<char> local_71;
  assert_equal local_70;
  allocator<char> local_48 [32];
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo bar",local_48);
  write_file(&temp_filename_abi_cxx11_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/process/test/test_util.cpp"
             ,&local_71);
  std::__cxx11::string::string((string *)&local_70,(string *)local_48);
  local_70._assert_msg._line = 0x46;
  read_file(&local_28,&temp_filename_abi_cxx11_);
  just::test::assert_equal::operator()(&local_70,"foo bar",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

JUST_TEST_CASE(test_read_and_write_file)
{
  write_file(temp_filename, "foo bar");
  JUST_ASSERT_EQUAL("foo bar", read_file(temp_filename));
}